

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O3

void Rwr_CutCountNumNodes_rec(Abc_Obj_t *pObj,Cut_Cut_t *pCut,Vec_Ptr_t *vNodes)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  ulong uVar4;
  
  while( true ) {
    if (0xfffffff < *(uint *)pCut) {
      uVar4 = 0;
      do {
        if (*(int *)(&pCut[1].field_0x0 + uVar4 * 4) == pObj->Id) {
          if ((*(uint *)&pObj->field_0x14 & 0x40) == 0) {
            *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 | 0x40;
            uVar1 = vNodes->nSize;
            if (uVar1 == vNodes->nCap) {
              if ((int)uVar1 < 0x10) {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar3 = (void **)malloc(0x80);
                }
                else {
                  ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
                }
                vNodes->pArray = ppvVar3;
                vNodes->nCap = 0x10;
              }
              else {
                if (vNodes->pArray == (void **)0x0) {
                  ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
                }
                vNodes->pArray = ppvVar3;
                vNodes->nCap = uVar1 * 2;
              }
            }
            else {
              ppvVar3 = vNodes->pArray;
            }
            iVar2 = vNodes->nSize;
            vNodes->nSize = iVar2 + 1;
            ppvVar3[iVar2] = pObj;
          }
          return;
        }
        uVar4 = uVar4 + 1;
      } while (*(uint *)pCut >> 0x1c != uVar4);
    }
    uVar1 = *(uint *)&pObj->field_0x14;
    if ((uVar1 & 0xf) != 7) break;
    if ((uVar1 & 0x40) == 0) {
      *(uint *)&pObj->field_0x14 = uVar1 | 0x40;
      uVar1 = vNodes->nSize;
      if (uVar1 == vNodes->nCap) {
        if ((int)uVar1 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = 0x10;
        }
        else {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vNodes->pArray,(ulong)uVar1 << 4);
          }
          vNodes->pArray = ppvVar3;
          vNodes->nCap = uVar1 * 2;
        }
      }
      else {
        ppvVar3 = vNodes->pArray;
      }
      iVar2 = vNodes->nSize;
      vNodes->nSize = iVar2 + 1;
      ppvVar3[iVar2] = pObj;
    }
    Rwr_CutCountNumNodes_rec
              ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray],pCut,vNodes);
    pObj = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[1]];
  }
  __assert_fail("Abc_ObjIsNode(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwr/rwrEva.c"
                ,0x1aa,"void Rwr_CutCountNumNodes_rec(Abc_Obj_t *, Cut_Cut_t *, Vec_Ptr_t *)");
}

Assistant:

void Rwr_CutCountNumNodes_rec( Abc_Obj_t * pObj, Cut_Cut_t * pCut, Vec_Ptr_t * vNodes )
{
    int i;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        if ( pCut->pLeaves[i] == pObj->Id )
        {
            // check if the node is collected
            if ( pObj->fMarkC == 0 )
            {
                pObj->fMarkC = 1;
                Vec_PtrPush( vNodes, pObj );
            }
            return;
        }
    assert( Abc_ObjIsNode(pObj) );
    // check if the node is collected
    if ( pObj->fMarkC == 0 )
    {
        pObj->fMarkC = 1;
        Vec_PtrPush( vNodes, pObj );
    }
    // traverse the fanins
    Rwr_CutCountNumNodes_rec( Abc_ObjFanin0(pObj), pCut, vNodes );
    Rwr_CutCountNumNodes_rec( Abc_ObjFanin1(pObj), pCut, vNodes );
}